

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O3

void __thiscall dmlc::JSONWriter::WriteString(JSONWriter *this,string *s)

{
  byte bVar1;
  long lVar2;
  char *pcVar3;
  ulong uVar4;
  char local_33;
  char local_32;
  char local_31;
  
  std::__ostream_insert<char,std::char_traits<char>>(this->os_,&local_32,1);
  if (s->_M_string_length != 0) {
    uVar4 = 0;
    do {
      bVar1 = (s->_M_dataplus)._M_p[uVar4];
      if (bVar1 < 0xd) {
        if (bVar1 == 9) {
          lVar2 = 2;
          pcVar3 = "\\t";
        }
        else if (bVar1 == 10) {
          lVar2 = 2;
          pcVar3 = "\\n";
        }
        else {
LAB_0011e77c:
          lVar2 = 1;
          pcVar3 = &local_33;
        }
      }
      else if (bVar1 == 0x5c) {
        lVar2 = 2;
        pcVar3 = "\\\\";
      }
      else if (bVar1 == 0x22) {
        lVar2 = 2;
        pcVar3 = "\\\"";
      }
      else {
        if (bVar1 != 0xd) goto LAB_0011e77c;
        lVar2 = 2;
        pcVar3 = "\\r";
      }
      std::__ostream_insert<char,std::char_traits<char>>(this->os_,pcVar3,lVar2);
      uVar4 = uVar4 + 1;
    } while (uVar4 < s->_M_string_length);
  }
  std::__ostream_insert<char,std::char_traits<char>>(this->os_,&local_31,1);
  return;
}

Assistant:

inline void JSONWriter::WriteString(const std::string &s) {
  Extend(os_, '\"');
  for (size_t i = 0; i < s.length(); ++i) {
    char ch = s[i];
    switch (ch) {
    case '\r':
      Extend(os_, "\\r");
      break;
    case '\n':
      Extend(os_, "\\n");
      break;
    case '\\':
      Extend(os_, "\\\\");
      break;
    case '\t':
      Extend(os_, "\\t");
      break;
    case '\"':
      Extend(os_, "\\\"");
      break;
    default:
      Extend(os_, ch);
    }
  }
  Extend(os_, '\"');
}